

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 int32_to_floatx80_mips64el(int32_t a,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  floatx80 fVar5;
  
  if (a == 0) {
    lVar3 = 0;
    iVar4 = 0;
  }
  else {
    uVar2 = (ulong)(uint)-a;
    if (0 < a) {
      uVar2 = (ulong)(uint)a;
    }
    uVar1 = 0x1f;
    if ((uint)uVar2 != 0) {
      for (; (uint)uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    lVar3 = uVar2 << ((byte)(uVar1 ^ 0x1f) & 0x3f | 0x20);
    iVar4 = (((uint)a >> 0x10 & 0x8000) - (uVar1 ^ 0x1f)) + 0x401e;
  }
  fVar5._8_4_ = iVar4;
  fVar5.low = lVar3;
  fVar5._12_4_ = 0;
  return fVar5;
}

Assistant:

floatx80 int32_to_floatx80(int32_t a, float_status *status)
{
    flag zSign;
    uint32_t absA;
    int8_t shiftCount;
    uint64_t zSig;

    if ( a == 0 ) return packFloatx80( 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz32(absA) + 32;
    zSig = absA;
    return packFloatx80( zSign, 0x403E - shiftCount, zSig<<shiftCount );

}